

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::_add_flag_internal(App *this,string *flag_name,callback_t *fun,string *flag_description)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MultiOptionPolicy MVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  _Manager_type p_Var5;
  pointer ppVar6;
  Option *this_00;
  IncorrectConstruction *__return_storage_ptr__;
  size_type sVar7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *fname;
  pointer __x;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  flag_defaults;
  string pos_name;
  _Any_data local_198;
  _Manager_type local_188;
  _Invoker_type local_180;
  _Any_data local_178;
  _Manager_type local_168;
  _Invoker_type local_160;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  _Any_data local_78;
  code *local_68;
  undefined8 uStack_60;
  string local_50;
  
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(flag_name->_M_dataplus)._M_p;
  sVar4 = flag_name->_M_string_length;
  if (sVar4 != 0) {
    sVar7 = 0;
    do {
      if ((paVar3->_M_local_buf[sVar7] == '!') || (paVar3->_M_local_buf[sVar7] == '{')) {
        detail::get_default_flag_values(&local_158,flag_name);
        detail::remove_default_flag_values(flag_name);
        local_118._M_dataplus._M_p = (flag_name->_M_dataplus)._M_p;
        paVar3 = &flag_name->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar3) {
          local_118.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
          local_118.field_2._8_8_ = *(undefined8 *)((long)&flag_name->field_2 + 8);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        }
        local_118._M_string_length = flag_name->_M_string_length;
        (flag_name->_M_dataplus)._M_p = (pointer)paVar3;
        flag_name->_M_string_length = 0;
        (flag_name->field_2)._M_local_buf[0] = '\0';
        local_168 = (_Manager_type)0x0;
        local_178._M_unused._M_object = (void *)0x0;
        local_178._8_8_ = 0;
        local_160 = fun->_M_invoker;
        p_Var5 = (fun->super__Function_base)._M_manager;
        if (p_Var5 != (_Manager_type)0x0) {
          local_178._M_unused._0_8_ =
               (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor;
          local_178._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
          (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
          fun->_M_invoker = (_Invoker_type)0x0;
          local_168 = p_Var5;
        }
        local_d8._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
        paVar3 = &flag_description->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p == paVar3) {
          local_d8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
          local_d8.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        }
        else {
          local_d8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
        }
        local_d8._M_string_length = flag_description->_M_string_length;
        (flag_description->_M_dataplus)._M_p = (pointer)paVar3;
        flag_description->_M_string_length = 0;
        (flag_description->field_2)._M_local_buf[0] = '\0';
        local_68 = (code *)0x0;
        uStack_60 = 0;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        this_00 = add_option(this,&local_118,(callback_t *)&local_178,&local_d8,false,
                             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                              *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (local_168 != (_Manager_type)0x0) {
          (*local_168)(&local_178,&local_178,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        ppVar6 = local_158.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_158.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_158.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          __x = local_158.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this_00->fnames_,&__x->first);
            __x = __x + 1;
          } while (__x != ppVar6);
        }
        local_b8.field_2._M_allocated_capacity =
             (size_type)
             (this_00->default_flag_values_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        (this_00->default_flag_values_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_158.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b8._M_dataplus._M_p =
             (pointer)(this_00->default_flag_values_).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        local_b8._M_string_length =
             (size_type)
             (this_00->default_flag_values_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        (this_00->default_flag_values_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_158.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        (this_00->default_flag_values_).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_158.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_158.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_158.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_158.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&local_b8);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_158);
        goto LAB_001a3113;
      }
      sVar7 = sVar7 + 1;
    } while (sVar4 != sVar7);
  }
  paVar1 = &flag_name->field_2;
  if (paVar3 == paVar1) {
    local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_138.field_2._8_8_ = *(undefined8 *)((long)&flag_name->field_2 + 8);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_138._M_dataplus._M_p = (pointer)paVar3;
  }
  (flag_name->_M_dataplus)._M_p = (pointer)paVar1;
  flag_name->_M_string_length = 0;
  (flag_name->field_2)._M_local_buf[0] = '\0';
  local_188 = (_Manager_type)0x0;
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = fun->_M_invoker;
  p_Var5 = (fun->super__Function_base)._M_manager;
  if (p_Var5 != (_Manager_type)0x0) {
    local_198._M_unused._0_8_ = (undefined8)*(undefined8 *)&(fun->super__Function_base)._M_functor;
    local_198._8_8_ = *(undefined8 *)((long)&(fun->super__Function_base)._M_functor + 8);
    (fun->super__Function_base)._M_manager = (_Manager_type)0x0;
    fun->_M_invoker = (_Invoker_type)0x0;
    local_188 = p_Var5;
  }
  local_f8._M_dataplus._M_p = (flag_description->_M_dataplus)._M_p;
  paVar3 = &flag_description->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == paVar3) {
    local_f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&flag_description->field_2 + 8);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_f8._M_string_length = flag_description->_M_string_length;
  (flag_description->_M_dataplus)._M_p = (pointer)paVar3;
  flag_description->_M_string_length = 0;
  (flag_description->field_2)._M_local_buf[0] = '\0';
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_138._M_string_length = sVar4;
  this_00 = add_option(this,&local_138,(callback_t *)&local_198,&local_f8,false,
                       (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                        *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_188 != (_Manager_type)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
LAB_001a3113:
  if ((this_00->pname_)._M_string_length != 0) {
    Option::get_name_abi_cxx11_(&local_b8,this_00,true,false);
    remove_option(this,this_00);
    __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_b8._M_dataplus._M_p,
               local_b8._M_dataplus._M_p +
               (long)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_b8._M_string_length);
    CLI::IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_50);
    __cxa_throw(__return_storage_ptr__,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
  }
  MVar2 = (this_00->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar2 != TakeLast) {
    if (((MVar2 == Throw) && (this_00->expected_max_ == 0x20000000)) && (1 < this_00->expected_min_)
       ) {
      this_00->expected_max_ = this_00->expected_min_;
    }
    (this_00->super_OptionBase<CLI::Option>).multi_option_policy_ = TakeLast;
    this_00->current_option_state_ = parsing;
  }
  this_00->expected_min_ = 0;
  this_00->expected_max_ = 0;
  this_00->flag_like_ = true;
  (this_00->super_OptionBase<CLI::Option>).required_ = false;
  return this_00;
}

Assistant:

CLI11_INLINE Option *App::_add_flag_internal(std::string flag_name, CLI::callback_t fun, std::string flag_description) {
    Option *opt = nullptr;
    if(detail::has_default_flag_values(flag_name)) {
        // check for default values and if it has them
        auto flag_defaults = detail::get_default_flag_values(flag_name);
        detail::remove_default_flag_values(flag_name);
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
        for(const auto &fname : flag_defaults)
            opt->fnames_.push_back(fname.first);
        opt->default_flag_values_ = std::move(flag_defaults);
    } else {
        opt = add_option(std::move(flag_name), std::move(fun), std::move(flag_description), false);
    }
    // flags cannot have positional values
    if(opt->get_positional()) {
        auto pos_name = opt->get_name(true);
        remove_option(opt);
        throw IncorrectConstruction::PositionalFlag(pos_name);
    }
    opt->multi_option_policy(MultiOptionPolicy::TakeLast);
    opt->expected(0);
    opt->required(false);
    return opt;
}